

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O0

double __thiscall embree::Averaged<double>::get(Averaged<double> *this)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *pdVar5;
  long in_RDI;
  undefined1 auVar6 [16];
  size_t i;
  size_t num;
  double sum;
  double t_begin;
  size_type in_stack_ffffffffffffffa8;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_ffffffffffffffb0;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *this_00;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_40;
  long local_38;
  double local_30;
  double local_18;
  
  sVar3 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    ((deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      *)0x16c598);
  if (sVar3 == 0) {
    local_18 = 0.0;
  }
  else {
    pvVar4 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    dVar1 = pvVar4->first;
    dVar2 = *(double *)(in_RDI + 0x58);
    local_30 = 0.0;
    local_38 = 0;
    local_40 = (deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)0x0;
    while( true ) {
      this_00 = local_40;
      pdVar5 = (deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                    )0x16c618);
      if (pdVar5 <= this_00) break;
      pvVar4 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](this_00,in_stack_ffffffffffffffa8);
      if (dVar1 - dVar2 <= pvVar4->first) {
        pvVar4 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,in_stack_ffffffffffffffa8);
        local_30 = pvVar4->second + local_30;
        local_38 = local_38 + 1;
      }
      local_40 = (deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 ((long)&(local_40->
                         super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         )._M_impl.super__Deque_impl_data._M_map + 1);
    }
    if (local_38 == 0) {
      local_18 = 0.0;
    }
    else {
      auVar6._8_4_ = (int)((ulong)local_38 >> 0x20);
      auVar6._0_8_ = local_38;
      auVar6._12_4_ = 0x45300000;
      local_18 = local_30 /
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0));
    }
  }
  return local_18;
}

Assistant:

Ty get() const
    {
      if (values.size() == 0) return zero;
      double t_begin = values[0].first-dt;

      Ty sum(zero);
      size_t num(0);
      for (size_t i=0; i<values.size(); i++) {
        if (values[i].first >= t_begin) {
          sum += values[i].second;
          num++;
        }
      }
      if (num == 0) return 0;
      else return sum/Ty(num);
    }